

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

int32_t parse_justice_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  int32_t iVar1;
  char *pcVar2;
  Btor2Parser *in_RSI;
  uint32_t nargs;
  undefined4 in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int32_t local_4;
  
  iVar1 = parse_pos_number_bfr
                    (in_RSI,(uint32_t *)
                            CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    pcVar2 = (char *)btor2parser_realloc((void *)CONCAT44(in_stack_ffffffffffffffe4,
                                                          in_stack_ffffffffffffffe0),
                                         CONCAT44(in_stack_ffffffffffffffdc,
                                                  in_stack_ffffffffffffffd8));
    in_RSI[1].error = pcVar2;
    *(undefined4 *)&in_RSI->file = in_stack_ffffffffffffffe4;
    iVar1 = parse_args(in_RSI,(Btor2Line *)
                              CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int32_t
parse_justice_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  uint32_t nargs;
  if (!parse_pos_number_bfr (bfr, &nargs)) return 0;
  l->args  = btor2parser_realloc (l->args, sizeof (int64_t) * nargs);
  l->nargs = nargs;
  if (!parse_args (bfr, l, nargs)) return 0;
  return 1;
}